

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O1

void __thiscall ConnmanTestMsg::ClearTestNodes(ConnmanTestMsg *this)

{
  pointer ppCVar1;
  CNode *this_00;
  pointer ppCVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device = &(this->super_CConnman).m_nodes_mutex.super_recursive_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  ppCVar1 = (this->super_CConnman).m_nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar2 = (this->super_CConnman).m_nodes.
                 super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar2 != ppCVar1; ppCVar2 = ppCVar2 + 1) {
    this_00 = *ppCVar2;
    if (this_00 != (CNode *)0x0) {
      CNode::~CNode(this_00);
      operator_delete(this_00,0x3a8);
    }
  }
  ppCVar2 = (this->super_CConnman).m_nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->super_CConnman).m_nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar2) {
    (this->super_CConnman).m_nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar2;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ClearTestNodes()
    {
        LOCK(m_nodes_mutex);
        for (CNode* node : m_nodes) {
            delete node;
        }
        m_nodes.clear();
    }